

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

string * __thiscall Edge::GetBinding(string *__return_storage_ptr__,Edge *this,string *key)

{
  undefined1 local_50 [8];
  EdgeEnv env;
  string *key_local;
  Edge *this_local;
  
  env._40_8_ = key;
  EdgeEnv::EdgeEnv((EdgeEnv *)local_50,this,kShellEscape);
  EdgeEnv::LookupVariable(__return_storage_ptr__,(EdgeEnv *)local_50,(string *)env._40_8_);
  EdgeEnv::~EdgeEnv((EdgeEnv *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string Edge::GetBinding(const std::string& key) const {
  EdgeEnv env(this, EdgeEnv::kShellEscape);
  return env.LookupVariable(key);
}